

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

DVector2 P_GetOffsetPosition(double x,double y,double dx,double dy)

{
  line_t_conflict *src;
  bool bVar1;
  uint uVar2;
  intercept_t *piVar3;
  uint uVar4;
  FLinePortal *pFVar5;
  double *in_RDI;
  double dVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  DVector2 DVar8;
  DVector2 hit;
  FLinePortalTraverse it;
  double local_98;
  double local_80;
  double local_78;
  FPathTraverse local_70;
  
  dVar6 = x + dx;
  dVar7 = y + dy;
  *in_RDI = dVar6;
  in_RDI[1] = dVar7;
  if (PortalBlockmap.containsLines == true) {
    if ((dx < 128.0) && (dy < 128.0)) {
      dVar7 = 0.0078125;
      uVar2 = (uint)((x - bmaporgx) * 0.0078125);
      dVar6 = (y - bmaporgy) * 0.0078125;
      uVar4 = (uint)dVar6;
      if (((int)(uVar4 | uVar2) < 0) ||
         (((bmapwidth <= (int)uVar2 || (bmapheight <= (int)uVar4)) ||
          (PortalBlockmap.data.Array[(int)(uVar4 * PortalBlockmap.dx + uVar2)].neighborContainsLines
           != true)))) goto LAB_004764e6;
    }
    local_98 = y;
    do {
      local_70._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_00702f50;
      dVar7 = local_98;
      FPathTraverse::init(&local_70,(EVP_PKEY_CTX *)0x9);
      piVar3 = FPathTraverse::Next(&local_70);
      if (piVar3 == (intercept_t *)0x0) {
        bVar1 = false;
      }
      else {
        src = (piVar3->d).line;
        if (src->portalindex < linePortals.Count) {
          pFVar5 = linePortals.Array + src->portalindex;
        }
        else {
          pFVar5 = (FLinePortal *)0x0;
        }
        if ((pFVar5->mFlags & 8) == 0) {
          bVar1 = false;
        }
        else {
          local_80 = local_70.trace.dx * piVar3->frac + local_70.trace.x;
          local_78 = piVar3->frac * local_70.trace.dy + local_70.trace.y;
          if (pFVar5->mType == '\x03') {
            dVar6 = (pFVar5->mDisplacement).X;
            local_80 = local_80 + dVar6;
            dVar7 = (pFVar5->mDisplacement).Y;
            local_78 = local_78 + dVar7;
            *in_RDI = dVar6 + *in_RDI;
            in_RDI[1] = dVar7 + in_RDI[1];
          }
          else {
            P_TranslatePortalXY(src,&local_80,&local_78);
            P_TranslatePortalXY(src,in_RDI,in_RDI + 1);
          }
          local_98 = local_78;
          bVar1 = true;
          dVar7 = local_80;
        }
      }
      FPathTraverse::~FPathTraverse(&local_70);
      dVar6 = extraout_XMM0_Qa;
    } while (bVar1);
  }
LAB_004764e6:
  DVar8.Y = dVar7;
  DVar8.X = dVar6;
  return DVar8;
}

Assistant:

DVector2 P_GetOffsetPosition(double x, double y, double dx, double dy)
{
	DVector2 dest(x + dx, y + dy);
	if (PortalBlockmap.containsLines)
	{
		double actx = x, acty = y;
		// Try some easily discoverable early-out first. If we know that the trace cannot possibly find a portal, this saves us from calling the traverser completely for vast parts of the map.
		if (dx < 128 && dy < 128)
		{
			int blockx = GetBlockX(actx);
			int blocky = GetBlockY(acty);
			if (blockx < 0 || blocky < 0 || blockx >= bmapwidth || blocky >= bmapheight || !PortalBlockmap(blockx, blocky).neighborContainsLines) return dest;
		}

		bool repeat;
		do
		{
			FLinePortalTraverse it;
			it.init(actx, acty, dx, dy, PT_ADDLINES|PT_DELTA);
			intercept_t *in;

			repeat = false;
			while ((in = it.Next()))
			{
				// hit a portal line.
				line_t *line = in->d.line;
				FLinePortal *port = line->getPortal();

				// Teleport portals are intentionally ignored since skipping this stuff is their entire reason for existence.
				if (port->mFlags & PORTF_INTERACTIVE)
				{
					DVector2 hit = it.InterceptPoint(in);

					if (port->mType == PORTT_LINKED)
					{
						// optimized handling for linked portals where we only need to add an offset.
						hit += port->mDisplacement;
						dest += port->mDisplacement;
					}
					else
					{
						// interactive ones are more complex because the vector may be rotated.
						// Note: There is no z-translation here, there's just too much code in the engine that wouldn't be able to handle interactive portals with a height difference.
						P_TranslatePortalXY(line, hit.X, hit.Y);
						P_TranslatePortalXY(line, dest.X, dest.Y);
					}
					// update the fields, end this trace and restart from the new position
					dx = dest.X - hit.X;
					dy = dest.Y - hit.Y;
					actx = hit.X;
					acty = hit.Y;
					repeat = true;
				}

				break;
			}
		} while (repeat);
	}
	return dest;
}